

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O2

MainBuilder * __thiscall
kj::MainBuilder::expectOptionalArg
          (MainBuilder *this,StringPtr title,
          Function<kj::MainBuilder::Validity_(kj::StringPtr)> *callback)

{
  Impl *pIVar1;
  Fault f;
  Arg local_38;
  
  local_38.title.content.size_ = title.content.size_;
  local_38.title.content.ptr = title.content.ptr;
  pIVar1 = (this->impl).ptr;
  if ((pIVar1->subCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    local_38.callback.impl.disposer = (callback->impl).disposer;
    local_38.callback.impl.ptr = (callback->impl).ptr;
    (callback->impl).ptr = (Iface *)0x0;
    local_38.minCount = 0;
    local_38.maxCount = 1;
    Vector<kj::MainBuilder::Impl::Arg>::add<kj::MainBuilder::Impl::Arg>(&pIVar1->args,&local_38);
    Own<kj::Function<kj::MainBuilder::Validity_(kj::StringPtr)>::Iface>::dispose
              (&local_38.callback.impl);
    return this;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[50]>
            ((Fault *)&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/main.c++"
             ,0x17d,FAILED,"impl->subCommands.empty()",
             "\"cannot have sub-commands when expecting arguments\"",
             (char (*) [50])"cannot have sub-commands when expecting arguments");
  _::Debug::Fault::fatal((Fault *)&local_38);
}

Assistant:

MainBuilder& MainBuilder::expectOptionalArg(
    StringPtr title, Function<Validity(StringPtr)> callback) {
  KJ_REQUIRE(impl->subCommands.empty(), "cannot have sub-commands when expecting arguments");
  impl->args.add(Impl::Arg { title, kj::mv(callback), 0, 1 });
  return *this;
}